

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

result_type
time_plain<boost::random::additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,40014u,0u,2147483563u>,boost::random::linear_congruential_engine<unsigned_int,40692u,0u,2147483399u>>>
          (additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,_40014U,_0U,_2147483563U>,_boost::random::linear_congruential_engine<unsigned_int,_40692U,_0U,_2147483399U>_>
           *r)

{
  result_type rVar1;
  ulong uVar2;
  time_t *in_RSI;
  string res;
  long i;
  long max;
  timer T;
  result_type s;
  double *in_stack_00000128;
  timer *in_stack_ffffffffffffff90;
  additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,_40014U,_0U,_2147483563U>,_boost::random::linear_congruential_engine<unsigned_int,_40692U,_0U,_2147483399U>_>
  *in_stack_ffffffffffffff98;
  string local_50 [32];
  long local_30;
  long local_28;
  timer local_20;
  result_type local_c;
  
  local_c = 0;
  timer::timer(in_stack_ffffffffffffff90);
  local_28 = 0x1000000;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    rVar1 = boost::random::
            additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,_40014U,_0U,_2147483563U>,_boost::random::linear_congruential_engine<unsigned_int,_40692U,_0U,_2147483399U>_>
            ::operator()(in_stack_ffffffffffffff98);
    local_c = rVar1 + local_c;
  }
  timer::time(&local_20,in_RSI);
  to_string<double>(in_stack_00000128);
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (9 < uVar2) break;
    std::__cxx11::string::operator+=(local_50,' ');
  }
  std::operator<<((ostream *)&std::cout,local_50);
  rVar1 = local_c;
  std::__cxx11::string::~string(local_50);
  return rVar1;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}